

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_dot_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float res;
  float fVar2;
  undefined8 local_18;
  float local_10;
  float local_c;
  undefined8 local_8;
  
  local_c = c->in[0].m_data[2];
  local_8 = *(undefined8 *)c->in[0].m_data;
  local_18 = *(undefined8 *)(c->in[1].m_data + 1);
  local_10 = c->in[1].m_data[0];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + (&local_c)[lVar1] * *(float *)((long)&local_18 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }